

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insert_bench.cc
# Opt level: O0

void __thiscall sfc64::sfc64(sfc64 *this,uint64_t _seed)

{
  int local_1c;
  int i;
  uint64_t _seed_local;
  sfc64 *this_local;
  
  this->m_a = _seed;
  this->m_b = _seed;
  this->m_c = _seed;
  this->m_counter = 1;
  for (local_1c = 0; local_1c < 0xc; local_1c = local_1c + 1) {
    operator()(this);
  }
  return;
}

Assistant:

sfc64(uint64_t _seed)
        : m_a(_seed)
        , m_b(_seed)
        , m_c(_seed)
        , m_counter(1) {
        for (int i = 0; i < 12; ++i) {
            operator()();
        }
    }